

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsourcedata.h
# Opt level: O2

void __thiscall jrtplib::RTPSourceData::FlushPackets(RTPSourceData *this)

{
  list<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_> *this_00;
  _List_node_base *p_Var1;
  
  this_00 = &this->packetlist;
  p_Var1 = (_List_node_base *)this_00;
  while (p_Var1 = (((_List_base<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_> *)
                   &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)this_00) {
    RTPDelete<jrtplib::RTPPacket>((RTPPacket *)p_Var1[1]._M_next,(this->super_RTPMemoryObject).mgr);
  }
  std::__cxx11::list<jrtplib::RTPPacket_*,_std::allocator<jrtplib::RTPPacket_*>_>::clear(this_00);
  return;
}

Assistant:

inline void RTPSourceData::FlushPackets()
{
	std::list<RTPPacket *>::const_iterator it;

	for (it = packetlist.begin() ; it != packetlist.end() ; ++it)
		RTPDelete(*it,GetMemoryManager());
	packetlist.clear();
}